

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

Expression * __thiscall
wasm::OptimizeInstructions::combineRelationalConstants
          (OptimizeInstructions *this,Binary *binary,Binary *left,Const *leftConst,Binary *right,
          Const *rightConst)

{
  BinaryOp BVar1;
  Type type;
  BinaryOp BVar2;
  undefined1 local_60 [8];
  Literal extra;
  
  type.id = (binary->right->type).id;
  Literal::Literal((Literal *)local_60,&leftConst->value);
  BVar1 = left->op;
  BVar2 = Abstract::getBinary(type,Sub);
  if (BVar1 == BVar2) {
    Literal::neg((Literal *)&extra.type,(Literal *)local_60);
    Literal::operator=((Literal *)local_60,(Literal *)&extra.type);
    Literal::~Literal((Literal *)&extra.type);
  }
  if (right != (Binary *)0x0) {
    BVar1 = right->op;
    BVar2 = Abstract::getBinary(type,Sub);
    if (BVar1 == BVar2) {
      Literal::neg((Literal *)&extra.type,(Literal *)local_60);
      Literal::operator=((Literal *)local_60,(Literal *)&extra.type);
      Literal::~Literal((Literal *)&extra.type);
    }
  }
  Literal::sub((Literal *)&extra.type,&rightConst->value,(Literal *)local_60);
  Literal::operator=(&rightConst->value,(Literal *)&extra.type);
  Literal::~Literal((Literal *)&extra.type);
  binary->left = left->left;
  Literal::~Literal((Literal *)local_60);
  return (Expression *)binary;
}

Assistant:

Expression* combineRelationalConstants(Binary* binary,
                                         Binary* left,
                                         Const* leftConst,
                                         Binary* right,
                                         Const* rightConst) {
    auto type = binary->right->type;
    // we fold constants to the right
    Literal extra = leftConst->value;
    if (left->op == Abstract::getBinary(type, Abstract::Sub)) {
      extra = extra.neg();
    }
    if (right && right->op == Abstract::getBinary(type, Abstract::Sub)) {
      extra = extra.neg();
    }
    rightConst->value = rightConst->value.sub(extra);
    binary->left = left->left;
    return binary;
  }